

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall duckdb::QueryProfiler::Initialize(QueryProfiler *this,PhysicalOperator *root_op)

{
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> _Var1;
  pointer pMVar2;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> _Var3;
  int iVar4;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> local_20;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar4 == 0) {
    if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true))
       && (this->running == true)) {
      this->query_requires_profiling = false;
      CreateTree((QueryProfiler *)&stack0xffffffffffffffe0,(PhysicalOperator *)this,
                 (profiler_settings_t *)root_op,(idx_t)&(this->context->config).profiler_settings);
      _Var3._M_head_impl = local_20._M_head_impl;
      local_20._M_head_impl = (ProfilingNode *)0x0;
      _Var1._M_head_impl =
           (this->root).
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
      (this->root).
      super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
      super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl = _Var3._M_head_impl;
      if (_Var1._M_head_impl != (ProfilingNode *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_ProfilingNode + 8))();
      }
      if ((ClientContext *)local_20._M_head_impl != (ClientContext *)0x0) {
        (*(code *)(((((ClientContext *)local_20._M_head_impl)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      if (this->query_requires_profiling == false) {
        this->running = false;
        ::std::
        _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::ProfilingNode>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(this->tree_map)._M_h);
        _Var1._M_head_impl =
             (this->root).
             super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
             .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
        (this->root).
        super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
        super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
        .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl = (ProfilingNode *)0x0;
        if (_Var1._M_head_impl != (ProfilingNode *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_ProfilingNode + 8))();
        }
        ::std::
        _Hashtable<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_double>,_std::allocator<std::pair<const_duckdb::MetricsType,_double>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(this->phase_timings)._M_h);
        pMVar2 = (this->phase_stack).
                 super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
                 super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->phase_stack).
            super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
            super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
            super__Vector_impl_data._M_finish != pMVar2) {
          (this->phase_stack).
          super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
          super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
          super__Vector_impl_data._M_finish = pMVar2;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar4);
}

Assistant:

void QueryProfiler::Initialize(const PhysicalOperator &root_op) {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}
	query_requires_profiling = false;
	ClientConfig &config = ClientConfig::GetConfig(context);
	root = CreateTree(root_op, config.profiler_settings, 0);
	if (!query_requires_profiling) {
		// query does not require profiling: disable profiling for this query
		this->running = false;
		tree_map.clear();
		root = nullptr;
		phase_timings.clear();
		phase_stack.clear();
	}
}